

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_swab.c
# Opt level: O0

void TIFFSwabArrayOfTriples(uint8_t *tp,tmsize_t n)

{
  undefined1 uVar1;
  uchar t;
  uchar *cp;
  tmsize_t n_local;
  uint8_t *tp_local;
  
  cp = (uchar *)n;
  n_local = (tmsize_t)tp;
  while (0 < (long)cp) {
    uVar1 = *(undefined1 *)(n_local + 2);
    *(undefined1 *)(n_local + 2) = *(undefined1 *)n_local;
    *(undefined1 *)n_local = uVar1;
    n_local = n_local + 3;
    cp = cp + -1;
  }
  return;
}

Assistant:

void TIFFSwabArrayOfTriples(register uint8_t *tp, tmsize_t n)
{
    unsigned char *cp;
    unsigned char t;

    /* XXX unroll loop some */
    while (n-- > 0)
    {
        cp = (unsigned char *)tp;
        t = cp[2];
        cp[2] = cp[0];
        cp[0] = t;
        tp += 3;
    }
}